

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutil.c
# Opt level: O1

int poly_mulmod(uint64_t *p1,uint64_t *p2,size_t n,uint64_t q,uint64_t *result)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  ulong uVar4;
  ulong *puVar5;
  ulong *puVar6;
  ulong *puVar7;
  size_t sVar8;
  size_t j;
  size_t sVar9;
  uint64_t *local_48;
  
  memset(result,0,n * 8);
  if (n != 0) {
    puVar6 = result + -n;
    sVar8 = 0;
    local_48 = result;
    do {
      sVar9 = 0;
      puVar7 = puVar6;
      do {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = p2[sVar9];
        auVar2._8_8_ = 0;
        auVar2._0_8_ = p1[sVar8];
        lVar3 = __umodti3(SUB168(auVar1 * auVar2,0),SUB168(auVar1 * auVar2,8),q,0);
        if (sVar9 + sVar8 < n) {
          uVar4 = lVar3 + local_48[sVar9];
          puVar5 = result + sVar9 + sVar8;
        }
        else {
          uVar4 = (q - lVar3) + *puVar7;
          puVar5 = puVar7;
        }
        *puVar5 = uVar4 % q;
        sVar9 = sVar9 + 1;
        puVar7 = puVar7 + 1;
      } while (n != sVar9);
      sVar8 = sVar8 + 1;
      puVar6 = puVar6 + 1;
      local_48 = local_48 + 1;
    } while (sVar8 != n);
  }
  return 0;
}

Assistant:

int poly_mulmod(uint64_t p1[], uint64_t p2[], size_t n, uint64_t q, uint64_t result[]) {

    memset(result, 0, n*sizeof(uint64_t));

    // p1 * p2 mod (x^n + 1)
    // the fact is exploited that x^n = -1   mod (x^n + 1)
    for(size_t i = 0; i < n; i++) {
        for(size_t j = 0; j < n; j++) {
            uint64_t tmp = mulmod(p1[i], p2[j], q);
            if(i+j < n) {
                result[i+j] = (result[i+j] + tmp) % q;
            } else {
                result[i+j-n] = (result[i+j-n] + q - tmp) %q;
            }
        }
    }

    return 0;

}